

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

cmListFileContext * __thiscall
cmDebugger_impl::CurrentLine(cmListFileContext *__return_storage_ptr__,cmDebugger_impl *this)

{
  cmDebugger_impl *this_local;
  
  cmListFileContext::cmListFileContext(__return_storage_ptr__,&this->currentLocation);
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext CurrentLine() const override { return currentLocation; }